

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O0

int TAP_SaveEmpty(path *fname)

{
  char *badValueMessage;
  bool bVar1;
  string local_40;
  FILE *local_20;
  FILE *ff;
  path *fname_local;
  
  ff = (FILE *)fname;
  local_20 = (FILE *)SJ_fopen(fname,"wb");
  bVar1 = local_20 != (FILE *)0x0;
  if (bVar1) {
    fclose(local_20);
  }
  else {
    std::filesystem::__cxx11::path::string(&local_40,(path *)ff);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",badValueMessage,PASS3);
    std::__cxx11::string::~string((string *)&local_40);
  }
  fname_local._4_4_ = (uint)bVar1;
  return fname_local._4_4_;
}

Assistant:

int TAP_SaveEmpty(const std::filesystem::path & fname) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str()); return 0;
	}
	fclose(ff);
	return 1;
}